

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3InvokeBusyHandler(BusyHandler *p,sqlite3_file *pFile)

{
  _func_int_void_ptr_int_sqlite3_file_ptr *xTra;
  int rc;
  sqlite3_file *pFile_local;
  BusyHandler *p_local;
  
  if ((p->xBusyHandler == (_func_int_void_ptr_int *)0x0) || (p->nBusy < 0)) {
    p_local._4_4_ = 0;
  }
  else {
    if (p->bExtraFileArg == '\0') {
      xTra._4_4_ = (*p->xBusyHandler)(p->pBusyArg,p->nBusy);
    }
    else {
      xTra._4_4_ = (*p->xBusyHandler)(p->pBusyArg,p->nBusy);
    }
    if (xTra._4_4_ == 0) {
      p->nBusy = -1;
    }
    else {
      p->nBusy = p->nBusy + 1;
    }
    p_local._4_4_ = xTra._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3InvokeBusyHandler(BusyHandler *p, sqlite3_file *pFile){
  int rc;
  if( p->xBusyHandler==0 || p->nBusy<0 ) return 0;
  if( p->bExtraFileArg ){
    /* Add an extra parameter with the pFile pointer to the end of the
    ** callback argument list */
    int (*xTra)(void*,int,sqlite3_file*);
    xTra = (int(*)(void*,int,sqlite3_file*))p->xBusyHandler;
    rc = xTra(p->pBusyArg, p->nBusy, pFile);
  }else{
    /* Legacy style busy handler callback */
    rc = p->xBusyHandler(p->pBusyArg, p->nBusy);
  }
  if( rc==0 ){
    p->nBusy = -1;
  }else{
    p->nBusy++;
  }
  return rc; 
}